

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_min_attribute.h
# Opt level: O3

void __thiscall
c74::min::
attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>::
set(attribute<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
    *this,atoms *args,bool notify,bool override_readonly)

{
  double dVar1;
  object_base *poVar2;
  int iVar3;
  t_object *ptVar4;
  double dVar5;
  atoms local_30;
  
  if ((byte)((this->super_attribute_base).m_readonly ^ 1U | override_readonly) == 1) {
    constrain<double,_0>(&local_30,this,args);
    dVar1 = this->m_value;
    dVar5 = (double)atom_getfloat(local_30.
                                  super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    if (local_30.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<c74::min::atom,_std::allocator<c74::min::atom>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((dVar5 != dVar1) || (NAN(dVar5) || NAN(dVar1))) {
      iVar3 = (*((this->super_attribute_base).m_owner)->_vptr_object_base[2])();
      if ((char)iVar3 == '\0') {
        attribute_threadsafe_helper<double,_(c74::min::threadsafe)1,_c74::min::limit::clamp,_(c74::min::allow_repetitions)1>
        ::set(&this->m_helper,args);
      }
      else {
        attribute_threadsafe_helper_do_set<double,(c74::min::threadsafe)1,c74::min::limit::clamp,(c74::min::allow_repetitions)1>
                  (&this->m_helper,args);
      }
      if ((this->super_attribute_base).m_name.s == k_sym_value) {
        poVar2 = (this->super_attribute_base).m_owner;
        ptVar4 = (t_object *)0x0;
        if (poVar2->m_min_magic == 0x75a8ec37) {
          ptVar4 = poVar2->m_maxobj;
        }
        object_notify(ptVar4,k_sym_modified,0);
      }
    }
  }
  return;
}

Assistant:

bool writable() const
    {
        return !m_readonly;
    }